

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# domain.cpp
# Opt level: O1

void __thiscall NetworkNS::Domain::Domain(Domain *this,string *filename)

{
  long *plVar1;
  double dVar2;
  pointer pbVar3;
  char cVar4;
  istream *piVar5;
  int i;
  int iVar6;
  long lVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  pointer pbVar9;
  double dVar10;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tokens;
  string buf;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lines_of_file;
  stringstream ss;
  ifstream data_file;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_418;
  pointer local_400;
  value_type local_3f8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3d8;
  undefined1 local_3c0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3b0 [7];
  ios_base local_340 [264];
  long local_238 [65];
  
  this->_vptr_Domain = (_func_int **)&PTR__Domain_0010fcf8;
  std::ifstream::ifstream((istream *)local_238,(filename->_M_dataplus)._M_p,_S_in);
  local_3d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_3d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar6 = 0xb;
  do {
    local_3c0._8_8_ = 0;
    local_3b0[0]._M_local_buf[0] = '\0';
    local_3c0._0_8_ = local_3c0 + 0x10;
    cVar4 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) + (char)(istream *)local_238
                           );
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)local_238,(string *)local_3c0,cVar4);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&local_3d8,(value_type *)local_3c0);
    if ((undefined1 *)local_3c0._0_8_ != local_3c0 + 0x10) {
      operator_delete((void *)local_3c0._0_8_,
                      CONCAT71(local_3b0[0]._M_allocated_capacity._1_7_,local_3b0[0]._M_local_buf[0]
                              ) + 1);
    }
    iVar6 = iVar6 + -1;
  } while (iVar6 != 0);
  local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
  local_3f8._M_string_length = 0;
  local_3f8.field_2._M_local_buf[0] = '\0';
  std::__cxx11::stringstream::stringstream((stringstream *)local_3c0);
  local_418.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_418.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_418.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar7 = 0;
  do {
    std::ostream::flush();
    pbVar3 = local_418.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (local_418.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_418.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      local_400 = local_418.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      paVar8 = &(local_418.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->field_2;
      do {
        plVar1 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (paVar8 + -1))->_M_dataplus)._M_p;
        if (paVar8 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)plVar1) {
          operator_delete(plVar1,paVar8->_M_allocated_capacity + 1);
        }
        pbVar9 = (pointer)(paVar8 + 1);
        paVar8 = paVar8 + 2;
      } while (pbVar9 != pbVar3);
      local_418.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = local_400;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_3c0 + 0x10),
               local_3d8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar7 + 8]._M_dataplus._M_p,
               local_3d8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar7 + 8]._M_string_length);
    while( true ) {
      piVar5 = std::operator>>((istream *)local_3c0,(string *)&local_3f8);
      pbVar3 = local_418.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0) break;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_418,&local_3f8);
    }
    dVar10 = atof(((local_418.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p);
    this->BoxLow[lVar7] = dVar10;
    dVar10 = atof(pbVar3[1]._M_dataplus._M_p);
    this->BoxHigh[lVar7] = dVar10;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 3);
  dVar2 = this->BoxHigh[0] - this->BoxLow[0];
  dVar10 = this->BoxHigh[1];
  this->XBoxLen = dVar2;
  this->iXBoxLen = 1.0 / dVar2;
  dVar10 = dVar10 - this->BoxLow[1];
  this->YBoxLen = dVar10;
  this->iYBoxLen = 1.0 / dVar10;
  dVar10 = this->BoxHigh[2] - this->BoxLow[2];
  this->ZBoxLen = dVar10;
  this->iZBoxLen = 1.0 / dVar10;
  this->BoxExists = 1;
  this->NonPeriodic = 0;
  this->Yperiodic = 1;
  this->Zperiodic = 1;
  this->Xperiodic = 1;
  this->Periodicity[0] = 1;
  this->Periodicity[1] = 1;
  this->Periodicity[2] = 1;
  this->Boundary[0] = (int  [2])0x0;
  this->Boundary[1] = (int  [2])0x0;
  this->Boundary[2] = (int  [2])0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_418);
  std::__cxx11::stringstream::~stringstream((stringstream *)local_3c0);
  std::ios_base::~ios_base(local_340);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
    operator_delete(local_3f8._M_dataplus._M_p,
                    CONCAT71(local_3f8.field_2._M_allocated_capacity._1_7_,
                             local_3f8.field_2._M_local_buf[0]) + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_3d8);
  std::ifstream::~ifstream(local_238);
  return;
}

Assistant:

Domain::Domain(std::string filename) {

      ifstream data_file(filename.c_str(), ifstream::in);
      /* Define an array of strings to hold the contents of the file. */
      std::vector <string> lines_of_file;

      for (int i = 0; i < 11; i++) {
         /* A temporary string for the current line of the file. */
         std::string current_line;
         getline(data_file, current_line);
         /* Add current line to file's array of lines. */
         lines_of_file.push_back(current_line);
      }

      /* x box dimension is stored in the 9th line: */
      string buf;
      stringstream ss;
      vector<string> tokens;

      // http://www.cplusplus.com/faq/sequences/strings/split/#boost-split

      for (int i = 0; i < 3; i++) {
         ss.flush();
         tokens.clear();
         ss << lines_of_file[8 + i];
         while (ss >> buf)
            tokens.push_back(buf);
         BoxLow[i] = atof(tokens[0].c_str());
         BoxHigh[i] = atof(tokens[1].c_str());
      }


      XBoxLen = BoxHigh[0] - BoxLow[0];
      iXBoxLen = 1.0 / XBoxLen;

      YBoxLen = BoxHigh[1] - BoxLow[1];
      iYBoxLen = 1.0 / YBoxLen;

      ZBoxLen = BoxHigh[2] - BoxLow[2];
      iZBoxLen = 1.0 / ZBoxLen;

      BoxExists = 1;
      NonPeriodic = 0;
      Xperiodic = Yperiodic = Zperiodic = 1;
      Periodicity[0] = Xperiodic;
      Periodicity[1] = Yperiodic;
      Periodicity[2] = Zperiodic;

      Boundary[0][0] = Boundary[0][1] = 0;
      Boundary[1][0] = Boundary[1][1] = 0;
      Boundary[2][0] = Boundary[2][1] = 0;

      return;
   }